

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O0

void compRHS(double **F,double **G,double **RHS,lattice *grid,double delt)

{
  double dVar1;
  double dVar2;
  int j;
  int i;
  double tmp;
  double facY;
  double facX;
  double delt_local;
  lattice *grid_local;
  double **RHS_local;
  double **G_local;
  double **F_local;
  
  dVar1 = grid->delx;
  dVar2 = grid->dely;
  for (i = 1; i <= grid->deli; i = i + 1) {
    for (j = 1; j <= grid->delj; j = j + 1) {
      RHS[i + -1][j + -1] =
           (F[i][j] - F[i + -1][j]) / (delt * dVar1) + (G[i][j] - G[i][j + -1]) / (delt * dVar2);
    }
  }
  return;
}

Assistant:

void compRHS (REAL **F, REAL **G, REAL **RHS, lattice *grid, REAL delt)
{
	REAL facX = delt*(grid->delx);
	REAL facY = delt*(grid->dely);
	REAL tmp;
	for (int i = 1; i <= grid->deli; i++)
		for (int j = 1; j <= grid->delj; j++)
		{
			tmp = (F[i][j] - F[i-1][j])/facX;
			RHS[i-1][j-1] = tmp + (G[i][j] - G[i][j-1])/facY;
		}
	return;
}